

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

int QuantizeBlock_C(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar4 = 0xffffffff;
  for (uVar5 = 0; uVar5 != 0x10; uVar5 = uVar5 + 1) {
    bVar1 = ""[uVar5];
    uVar2 = *(ushort *)((long)in + (ulong)((uint)bVar1 * 2));
    uVar6 = -uVar2;
    if (0 < (short)uVar2) {
      uVar6 = uVar2;
    }
    uVar8 = (uint)*(ushort *)((long)mtx->sharpen_ + (ulong)((uint)bVar1 * 2)) + (uint)uVar6;
    if (mtx->zthresh_[bVar1] < uVar8) {
      uVar7 = (ulong)((uint)bVar1 + (uint)bVar1);
      uVar8 = uVar8 * *(ushort *)((long)mtx->iq_ + uVar7) + mtx->bias_[bVar1] >> 0x11;
      if (0x7fe < uVar8) {
        uVar8 = 0x7ff;
      }
      uVar3 = -uVar8;
      if (-1 < (short)uVar2) {
        uVar3 = uVar8;
      }
      *(short *)((long)in + uVar7) = *(short *)((long)mtx->q_ + uVar7) * (short)uVar3;
      out[uVar5] = (short)uVar3;
      if (uVar3 != 0) {
        uVar4 = uVar5 & 0xffffffff;
      }
    }
    else {
      out[uVar5] = 0;
      in[bVar1] = 0;
    }
  }
  return ~(uint)uVar4 >> 0x1f;
}

Assistant:

static int QuantizeBlock_C(int16_t in[16], int16_t out[16],
                           const VP8Matrix* const mtx) {
  int last = -1;
  int n;
  for (n = 0; n < 16; ++n) {
    const int j = kZigzag[n];
    const int sign = (in[j] < 0);
    const uint32_t coeff = (sign ? -in[j] : in[j]) + mtx->sharpen_[j];
    if (coeff > mtx->zthresh_[j]) {
      const uint32_t Q = mtx->q_[j];
      const uint32_t iQ = mtx->iq_[j];
      const uint32_t B = mtx->bias_[j];
      int level = QUANTDIV(coeff, iQ, B);
      if (level > MAX_LEVEL) level = MAX_LEVEL;
      if (sign) level = -level;
      in[j] = level * (int)Q;
      out[n] = level;
      if (level) last = n;
    } else {
      out[n] = 0;
      in[j] = 0;
    }
  }
  return (last >= 0);
}